

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O1

string * sciplot::internal::removeExtraWhitespaces(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string local_38;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar1,pcVar1 + s->_M_string_length)
  ;
  _Var2 = std::
          __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<sciplot::internal::collapseWhitespaces(std::__cxx11::string)::_lambda(unsigned_char,unsigned_char)_1_>>
                    (local_58,local_58->_M_local_buf + local_50);
  local_38._M_string_length = (long)_Var2._M_current - (long)local_58;
  *_Var2._M_current = '\0';
  if (local_58 == &local_48) {
    local_38.field_2._8_8_ = local_48._8_8_;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38._M_dataplus._M_p = (pointer)local_58;
  }
  local_38.field_2._M_allocated_capacity._1_7_ = local_48._M_allocated_capacity._1_7_;
  local_38.field_2._M_local_buf[0] = local_48._M_local_buf[0];
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_58 = &local_48;
  trim(__return_storage_ptr__,&local_38,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto removeExtraWhitespaces(std::string s) -> std::string
{
    return trim(collapseWhitespaces(s));
}